

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O0

void * slab_map(slab_arena *arena)

{
  size_t *psVar1;
  size_t sVar2;
  ssize_t sVar3;
  ulong uVar4;
  size_t used;
  void *ptr;
  slab_arena *arena_local;
  
  arena_local = (slab_arena *)lf_lifo_pop(&arena->cache);
  if (arena_local == (slab_arena *)0x0) {
    sVar3 = quota_use(arena->quota,(ulong)arena->slab_size);
    if (sVar3 < 0) {
      arena_local = (slab_arena *)0x0;
    }
    else {
      LOCK();
      psVar1 = &arena->used;
      sVar2 = *psVar1;
      *psVar1 = *psVar1 + (ulong)arena->slab_size;
      UNLOCK();
      uVar4 = arena->slab_size + sVar2;
      if (arena->prealloc < uVar4) {
        arena_local = (slab_arena *)
                      mmap_checked((ulong)arena->slab_size,(ulong)arena->slab_size,arena->flags);
        if (arena_local == (slab_arena *)0x0) {
          LOCK();
          arena->used = arena->used - (ulong)arena->slab_size;
          UNLOCK();
          quota_release(arena->quota,(ulong)arena->slab_size);
        }
        madvise_checked(arena_local,(ulong)arena->slab_size,arena->flags);
      }
      else {
        arena_local = (slab_arena *)((long)arena->arena + (uVar4 - arena->slab_size));
      }
    }
  }
  return arena_local;
}

Assistant:

void *
slab_map(struct slab_arena *arena)
{
	void *ptr;
	if ((ptr = lf_lifo_pop(&arena->cache))) {
		VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
		return ptr;
	}

	if (quota_use(arena->quota, arena->slab_size) < 0)
		return NULL;

	/** Need to allocate a new slab. */
	size_t used = pm_atomic_fetch_add(&arena->used, arena->slab_size);
	used += arena->slab_size;
	if (used <= arena->prealloc) {
		ptr = arena->arena + used - arena->slab_size;
		VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
		return ptr;
	}

	ptr = mmap_checked(arena->slab_size, arena->slab_size,
			   arena->flags);
	if (!ptr) {
		__sync_sub_and_fetch(&arena->used, arena->slab_size);
		quota_release(arena->quota, arena->slab_size);
	}

	madvise_checked(ptr, arena->slab_size, arena->flags);

	VALGRIND_MAKE_MEM_UNDEFINED(ptr, arena->slab_size);
	return ptr;
}